

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

int sznet::net::sockets::sz_sock_geterror(sz_sock sockfd)

{
  int iVar1;
  socklen_t local_18;
  int local_14;
  socklen_t optlen;
  int optval;
  sz_sock sockfd_local;
  
  local_18 = 4;
  optlen = sockfd;
  iVar1 = getsockopt(sockfd,1,4,&local_14,&local_18);
  if (iVar1 < 0) {
    optval = sz_getlasterr();
  }
  else {
    optval = local_14;
  }
  return optval;
}

Assistant:

int sz_sock_geterror(sz_sock sockfd)
{
	int optval;
	socklen_t optlen = static_cast<socklen_t>(sizeof(optval));
	if (::getsockopt(sockfd, SOL_SOCKET, SO_ERROR, (char*)&optval, &optlen) < 0)
	{
		return sz_getlasterr();
	}
	else
	{
		return optval;
	}
}